

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-combat.cpp
# Opt level: O3

decks_t * play<void(*)(std::deque<unsigned_long,std::allocator<unsigned_long>>&,std::deque<unsigned_long,std::allocator<unsigned_long>>&)>
                    (decks_t *__return_storage_ptr__,decks_t *decks,size_t p1,size_t p2,
                    _func_void_deque<unsigned_long,_std::allocator<unsigned_long>_>_ptr_deque<unsigned_long,_std::allocator<unsigned_long>_>_ptr
                    *strategy)

{
  long *plVar1;
  long *plVar2;
  iterator iVar3;
  iterator iVar4;
  decks_t *pdVar5;
  decks_t *extraout_RAX;
  char *pcVar6;
  __hashtable *__h;
  long *plVar7;
  size_t local_30;
  size_t local_28;
  
  local_30 = p2;
  local_28 = p1;
  iVar3 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&decks->_M_h,&local_28);
  if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>._M_cur !=
      (__node_type *)0x0) {
    iVar4 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&decks->_M_h,&local_30);
    if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>._M_cur !=
        (__node_type *)0x0) {
      (*strategy)((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>.
                         _M_cur + 0x18),
                  (deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>.
                         _M_cur + 0x18));
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_Hashtable(&__return_storage_ptr__->_M_h,decks,decks);
      return __return_storage_ptr__;
    }
  }
  pcVar6 = "_Map_base::at";
  pdVar5 = (decks_t *)std::__throw_out_of_range("_Map_base::at");
  plVar7 = *(long **)pcVar6;
  plVar1 = *(long **)((long)pcVar6 + 8);
  if (plVar7 != plVar1) {
    plVar7 = plVar7 + 2;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      pdVar5 = (decks_t *)(plVar7 + 4);
      plVar2 = plVar7 + 2;
      plVar7 = (long *)pdVar5;
    } while (plVar2 != plVar1);
    plVar7 = *(long **)pcVar6;
  }
  if (plVar7 != (long *)0x0) {
    operator_delete(plVar7,*(long *)((long)pcVar6 + 0x10) - (long)plVar7);
    return extraout_RAX;
  }
  return pdVar5;
}

Assistant:

auto play(decks_t decks, size_t p1, size_t p2, T strategy) {
  auto& p1d = decks.at(p1).cards;
  auto& p2d = decks.at(p2).cards;
  strategy(p1d, p2d);
  return decks;
}